

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

bool __thiscall QPDF::findHeader(QPDF *this)

{
  byte bVar1;
  int iVar2;
  pointer pMVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  logic_error *this_00;
  OffsetInputSource *this_01;
  shared_ptr<InputSource> local_98;
  shared_ptr<InputSource> local_88;
  byte local_71;
  undefined1 local_70 [7];
  bool valid;
  string version;
  char *local_40;
  char *p;
  string line;
  qpdf_offset_t global_offset;
  QPDF *this_local;
  
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar3->file);
  iVar2 = (*peVar4->_vptr_InputSource[4])();
  line.field_2._8_8_ = CONCAT44(extraout_var,iVar2);
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar3->file);
  InputSource::readLine_abi_cxx11_((string *)&p,peVar4,0x400);
  local_40 = (char *)std::__cxx11::string::c_str();
  iVar2 = strncmp(local_40,"%PDF-",5);
  if (iVar2 == 0) {
    local_40 = local_40 + 5;
    std::__cxx11::string::string((string *)local_70);
    local_71 = validatePDFVersion(&local_40,(string *)local_70);
    if ((bool)local_71) {
      pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      std::__cxx11::string::operator=((string *)&pMVar3->pdf_version,(string *)local_70);
      if (line.field_2._8_8_ != 0) {
        QTC::TC("qpdf","QPDF global offset",0);
        this_01 = (OffsetInputSource *)operator_new(200);
        pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        std::shared_ptr<InputSource>::shared_ptr(&local_98,&pMVar3->file);
        OffsetInputSource::OffsetInputSource(this_01,&local_98,line.field_2._8_8_);
        std::shared_ptr<InputSource>::shared_ptr<OffsetInputSource,void>(&local_88,this_01);
        pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        std::shared_ptr<InputSource>::operator=(&pMVar3->file,&local_88);
        std::shared_ptr<InputSource>::~shared_ptr(&local_88);
        std::shared_ptr<InputSource>::~shared_ptr(&local_98);
      }
    }
    bVar1 = local_71;
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)&p);
    return (bool)(bVar1 & 1);
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"findHeader is not looking at %PDF-");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

bool
QPDF::findHeader()
{
    qpdf_offset_t global_offset = m->file->tell();
    std::string line = m->file->readLine(1024);
    char const* p = line.c_str();
    if (strncmp(p, "%PDF-", 5) != 0) {
        throw std::logic_error("findHeader is not looking at %PDF-");
    }
    p += 5;
    std::string version;
    // Note: The string returned by line.c_str() is always null-terminated. The code below never
    // overruns the buffer because a null character always short-circuits further advancement.
    bool valid = validatePDFVersion(p, version);
    if (valid) {
        m->pdf_version = version;
        if (global_offset != 0) {
            // Empirical evidence strongly suggests that when there is leading material prior to the
            // PDF header, all explicit offsets in the file are such that 0 points to the beginning
            // of the header.
            QTC::TC("qpdf", "QPDF global offset");
            m->file = std::shared_ptr<InputSource>(new OffsetInputSource(m->file, global_offset));
        }
    }
    return valid;
}